

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder_read_pcm_frames
                    (ma_decoder *pDecoder,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  int iVar1;
  ma_result mVar2;
  ma_uint32 mVar3;
  void *pvVar4;
  ma_uint64 *frameCount_00;
  ma_uint64 *pmVar5;
  ulong *in_RCX;
  ulong in_RDX;
  ma_data_converter *in_RSI;
  long in_RDI;
  ma_uint64 requiredInputFrameCount;
  ma_uint64 framesReadThisIterationOut;
  ma_uint64 framesToReadThisIterationOut_1;
  ma_uint64 framesReadThisIterationIn;
  ma_uint64 framesToReadThisIterationIn_1;
  ma_uint64 intermediaryBufferCap;
  ma_uint8 pIntermediaryBuffer [4096];
  ma_uint64 framesToReadThisIterationOut;
  ma_uint64 framesToReadThisIterationIn;
  ma_uint32 internalChannels;
  ma_format internalFormat;
  void *pRunningFramesOut;
  ma_uint64 totalFramesReadOut;
  ma_result result;
  ma_uint64 *in_stack_ffffffffffffef28;
  ma_uint64 *in_stack_ffffffffffffef30;
  ma_data_converter *in_stack_ffffffffffffef38;
  void *in_stack_ffffffffffffef40;
  ma_data_converter *in_stack_ffffffffffffef48;
  ma_uint32 *in_stack_ffffffffffffef50;
  ma_uint64 *in_stack_ffffffffffffef58;
  ma_format *in_stack_ffffffffffffef60;
  ma_uint64 *pmVar6;
  ma_data_source *in_stack_ffffffffffffef68;
  long local_1090;
  ma_uint64 *in_stack_ffffffffffffef78;
  ma_uint64 in_stack_ffffffffffffef80;
  undefined1 in_stack_ffffffffffffef88;
  undefined7 in_stack_ffffffffffffef89;
  ma_data_source *in_stack_ffffffffffffef90;
  void *local_68;
  int local_60;
  ma_format local_5c;
  ma_data_converter *local_58;
  ulong local_50;
  ma_result local_44;
  ma_result local_1c;
  
  if (in_RCX != (ulong *)0x0) {
    *in_RCX = 0;
  }
  if (in_RDX == 0) {
    local_1c = MA_INVALID_ARGS;
  }
  else if (in_RDI == 0) {
    local_1c = MA_INVALID_ARGS;
  }
  else if (*(long *)(in_RDI + 0x48) == 0) {
    local_1c = MA_INVALID_OPERATION;
  }
  else {
    if (*(char *)(in_RDI + 0x1c4) == '\0') {
      if ((in_RSI == (ma_data_converter *)0x0) && (*(char *)(in_RDI + 0x1c3) == '\0')) {
        local_44 = ma_data_source_read_pcm_frames
                             (in_stack_ffffffffffffef90,
                              (void *)CONCAT71(in_stack_ffffffffffffef89,in_stack_ffffffffffffef88),
                              in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
      }
      else {
        local_50 = 0;
        mVar2 = ma_data_source_get_data_format
                          (in_stack_ffffffffffffef68,in_stack_ffffffffffffef60,
                           (ma_uint32 *)in_stack_ffffffffffffef58,in_stack_ffffffffffffef50,
                           (ma_channel *)in_stack_ffffffffffffef48,(size_t)in_stack_ffffffffffffef40
                          );
        if (mVar2 != MA_SUCCESS) {
          return mVar2;
        }
        local_44 = MA_SUCCESS;
        local_58 = in_RSI;
        mVar2 = MA_SUCCESS;
        if (*(long *)(in_RDI + 0x1d0) == 0) {
          do {
            if (in_RDX <= local_50) break;
            mVar3 = ma_get_bytes_per_sample(local_5c);
            frameCount_00 =
                 SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar3 * local_60),0);
            pmVar5 = (ma_uint64 *)(in_RDX - local_50);
            pmVar6 = pmVar5;
            if (frameCount_00 < pmVar5) {
              pmVar6 = frameCount_00;
            }
            ma_data_converter_get_required_input_frame_count
                      (in_stack_ffffffffffffef38,(ma_uint64)in_stack_ffffffffffffef30,
                       in_stack_ffffffffffffef28);
            if (in_stack_ffffffffffffef58 < pmVar6) {
              pmVar6 = in_stack_ffffffffffffef58;
            }
            if (in_stack_ffffffffffffef58 == (ma_uint64 *)0x0) {
              local_1090 = 0;
              in_stack_ffffffffffffef88 = 0;
            }
            else {
              local_44 = ma_data_source_read_pcm_frames
                                   (in_stack_ffffffffffffef90,
                                    (void *)CONCAT71(in_stack_ffffffffffffef89,
                                                     in_stack_ffffffffffffef88),
                                    (ma_uint64)frameCount_00,pmVar6);
              if ((local_44 != MA_SUCCESS) && (local_44 != MA_AT_END)) break;
            }
            local_44 = ma_data_converter_process_pcm_frames
                                 (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                  (ma_uint64 *)in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,
                                  in_stack_ffffffffffffef28);
            if (local_44 != MA_SUCCESS) break;
            local_50 = (long)pmVar5 + local_50;
            pmVar6 = pmVar5;
            if (local_58 != (ma_data_converter *)0x0) {
              iVar1 = *(int *)(in_RDI + 0x8c);
              mVar3 = ma_get_bytes_per_sample(*(ma_format *)(in_RDI + 0x88));
              in_stack_ffffffffffffef30 = pmVar5;
              in_stack_ffffffffffffef38 = local_58;
              local_58 = (ma_data_converter *)
                         ((long)&local_58->formatIn + (long)pmVar5 * (ulong)(mVar3 * iVar1));
            }
          } while ((local_1090 != 0) || (pmVar6 != (ma_uint64 *)0x0));
        }
        else {
          do {
            do {
              local_44 = mVar2;
              if (in_RDX <= local_50) goto LAB_001f24e7;
              if (*(long *)(in_RDI + 0x1e8) != 0) {
                pvVar4 = (void *)(in_RDX - local_50);
                local_68 = pvVar4;
                if (*(void **)(in_RDI + 0x1e8) < pvVar4) {
                  local_68 = *(void **)(in_RDI + 0x1e8);
                }
                ma_offset_pcm_frames_ptr
                          (in_stack_ffffffffffffef48,(ma_uint64)in_stack_ffffffffffffef40,
                           (ma_format)((ulong)in_stack_ffffffffffffef38 >> 0x20),
                           (ma_uint32)in_stack_ffffffffffffef38);
                local_44 = ma_data_converter_process_pcm_frames
                                     (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                      (ma_uint64 *)in_stack_ffffffffffffef38,
                                      in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
                if (local_44 != MA_SUCCESS) goto LAB_001f24e7;
                *(long *)(in_RDI + 0x1e0) = (long)local_68 + *(long *)(in_RDI + 0x1e0);
                *(long *)(in_RDI + 0x1e8) = *(long *)(in_RDI + 0x1e8) - (long)local_68;
                local_50 = (long)pvVar4 + local_50;
                if (local_58 != (ma_data_converter *)0x0) {
                  iVar1 = *(int *)(in_RDI + 0x8c);
                  in_stack_ffffffffffffef40 = pvVar4;
                  mVar3 = ma_get_bytes_per_sample(*(ma_format *)(in_RDI + 0x88));
                  in_stack_ffffffffffffef48 = local_58;
                  local_58 = (ma_data_converter *)
                             ((long)&local_58->formatIn +
                             (long)in_stack_ffffffffffffef40 * (ulong)(mVar3 * iVar1));
                }
                if ((local_68 == (void *)0x0) && (pvVar4 == (void *)0x0)) goto LAB_001f24e7;
              }
              mVar2 = local_44;
            } while (*(long *)(in_RDI + 0x1e8) != 0);
            *(undefined8 *)(in_RDI + 0x1e0) = 0;
            local_44 = ma_data_source_read_pcm_frames
                                 (in_stack_ffffffffffffef90,
                                  (void *)CONCAT71(in_stack_ffffffffffffef89,
                                                   in_stack_ffffffffffffef88),
                                  in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
            mVar2 = local_44;
          } while (local_44 == MA_SUCCESS);
        }
      }
    }
    else {
      local_44 = ma_data_source_read_pcm_frames
                           (in_stack_ffffffffffffef90,
                            (void *)CONCAT71(in_stack_ffffffffffffef89,in_stack_ffffffffffffef88),
                            in_stack_ffffffffffffef80,in_stack_ffffffffffffef78);
    }
LAB_001f24e7:
    *(ulong *)(in_RDI + 0x80) = local_50 + *(long *)(in_RDI + 0x80);
    if (in_RCX != (ulong *)0x0) {
      *in_RCX = local_50;
    }
    if ((local_44 == MA_SUCCESS) && (local_50 == 0)) {
      local_44 = MA_AT_END;
    }
    local_1c = local_44;
  }
  return local_1c;
}

Assistant:

MA_API ma_result ma_decoder_read_pcm_frames(ma_decoder* pDecoder, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_uint64 totalFramesReadOut;
    void* pRunningFramesOut;

    if (pFramesRead != NULL) {
        *pFramesRead = 0;   /* Safety. */
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder->pBackend == NULL) {
        return MA_INVALID_OPERATION;
    }

    /* Fast path. */
    if (pDecoder->converter.isPassthrough) {
        result = ma_data_source_read_pcm_frames(pDecoder->pBackend, pFramesOut, frameCount, &totalFramesReadOut);
    } else {
        /*
        Getting here means we need to do data conversion. If we're seeking forward and are _not_ doing resampling we can run this in a fast path. If we're doing resampling we
        need to run through each sample because we need to ensure its internal cache is updated.
        */
        if (pFramesOut == NULL && pDecoder->converter.hasResampler == MA_FALSE) {
            result = ma_data_source_read_pcm_frames(pDecoder->pBackend, NULL, frameCount, &totalFramesReadOut);
        } else {
            /* Slow path. Need to run everything through the data converter. */
            ma_format internalFormat;
            ma_uint32 internalChannels;

            totalFramesReadOut = 0;
            pRunningFramesOut  = pFramesOut;

            result = ma_data_source_get_data_format(pDecoder->pBackend, &internalFormat, &internalChannels, NULL, NULL, 0);
            if (result != MA_SUCCESS) {
                return result;   /* Failed to retrieve the internal format and channel count. */
            }

            /*
            We run a different path depending on whether or not we are using a heap-allocated
            intermediary buffer or not. If the data converter does not support the calculation of
            the required number of input frames, we'll use the heap-allocated path. Otherwise we'll
            use the stack-allocated path.
            */
            if (pDecoder->pInputCache != NULL) {
                /* We don't have a way of determining the required number of input frames, so need to persistently store input data in a cache. */
                while (totalFramesReadOut < frameCount) {
                    ma_uint64 framesToReadThisIterationIn;
                    ma_uint64 framesToReadThisIterationOut;

                    /* If there's any data available in the cache, that needs to get processed first. */
                    if (pDecoder->inputCacheRemaining > 0) {
                        framesToReadThisIterationOut = (frameCount - totalFramesReadOut);
                        framesToReadThisIterationIn  = framesToReadThisIterationOut;
                        if (framesToReadThisIterationIn > pDecoder->inputCacheRemaining) {
                            framesToReadThisIterationIn = pDecoder->inputCacheRemaining;
                        }

                        result = ma_data_converter_process_pcm_frames(&pDecoder->converter, ma_offset_pcm_frames_ptr(pDecoder->pInputCache, pDecoder->inputCacheConsumed, internalFormat, internalChannels), &framesToReadThisIterationIn, pRunningFramesOut, &framesToReadThisIterationOut);
                        if (result != MA_SUCCESS) {
                            break;
                        }

                        pDecoder->inputCacheConsumed  += framesToReadThisIterationIn;
                        pDecoder->inputCacheRemaining -= framesToReadThisIterationIn;

                        totalFramesReadOut += framesToReadThisIterationOut;

                        if (pRunningFramesOut != NULL) {
                            pRunningFramesOut = ma_offset_ptr(pRunningFramesOut, framesToReadThisIterationOut * ma_get_bytes_per_frame(pDecoder->outputFormat, pDecoder->outputChannels));
                        }

                        if (framesToReadThisIterationIn == 0 && framesToReadThisIterationOut == 0) {
                            break;  /* We're done. */
                        }
                    }

                    /* Getting here means there's no data in the cache and we need to fill it up from the data source. */
                    if (pDecoder->inputCacheRemaining == 0) {
                        pDecoder->inputCacheConsumed = 0;

                        result = ma_data_source_read_pcm_frames(pDecoder->pBackend, pDecoder->pInputCache, pDecoder->inputCacheCap, &pDecoder->inputCacheRemaining);
                        if (result != MA_SUCCESS) {
                            break;
                        }
                    }
                }
            } else {
                /* We have a way of determining the required number of input frames so just use the stack. */
                while (totalFramesReadOut < frameCount) {
                    ma_uint8 pIntermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];  /* In internal format. */
                    ma_uint64 intermediaryBufferCap = sizeof(pIntermediaryBuffer) / ma_get_bytes_per_frame(internalFormat, internalChannels);
                    ma_uint64 framesToReadThisIterationIn;
                    ma_uint64 framesReadThisIterationIn;
                    ma_uint64 framesToReadThisIterationOut;
                    ma_uint64 framesReadThisIterationOut;
                    ma_uint64 requiredInputFrameCount;

                    framesToReadThisIterationOut = (frameCount - totalFramesReadOut);
                    framesToReadThisIterationIn = framesToReadThisIterationOut;
                    if (framesToReadThisIterationIn > intermediaryBufferCap) {
                        framesToReadThisIterationIn = intermediaryBufferCap;
                    }

                    ma_data_converter_get_required_input_frame_count(&pDecoder->converter, framesToReadThisIterationOut, &requiredInputFrameCount);
                    if (framesToReadThisIterationIn > requiredInputFrameCount) {
                        framesToReadThisIterationIn = requiredInputFrameCount;
                    }

                    if (requiredInputFrameCount > 0) {
                        result = ma_data_source_read_pcm_frames(pDecoder->pBackend, pIntermediaryBuffer, framesToReadThisIterationIn, &framesReadThisIterationIn);

                        /*
                        Note here that even if we've reached the end, we don't want to abort because there might be more output frames needing to be
                        generated from cached input data, which might happen if resampling is being performed.
                        */
                        if (result != MA_SUCCESS && result != MA_AT_END) {
                            break;
                        }
                    } else {
                        framesReadThisIterationIn = 0;
                        pIntermediaryBuffer[0] = 0; /* <-- This is just to silence a static analysis warning. */
                    }

                    /*
                    At this point we have our decoded data in input format and now we need to convert to output format. Note that even if we didn't read any
                    input frames, we still want to try processing frames because there may some output frames generated from cached input data.
                    */
                    framesReadThisIterationOut = framesToReadThisIterationOut;
                    result = ma_data_converter_process_pcm_frames(&pDecoder->converter, pIntermediaryBuffer, &framesReadThisIterationIn, pRunningFramesOut, &framesReadThisIterationOut);
                    if (result != MA_SUCCESS) {
                        break;
                    }

                    totalFramesReadOut += framesReadThisIterationOut;

                    if (pRunningFramesOut != NULL) {
                        pRunningFramesOut = ma_offset_ptr(pRunningFramesOut, framesReadThisIterationOut * ma_get_bytes_per_frame(pDecoder->outputFormat, pDecoder->outputChannels));
                    }

                    if (framesReadThisIterationIn == 0 && framesReadThisIterationOut == 0) {
                        break;  /* We're done. */
                    }
                }
            }
        }
    }

    pDecoder->readPointerInPCMFrames += totalFramesReadOut;

    if (pFramesRead != NULL) {
        *pFramesRead = totalFramesReadOut;
    }

    if (result == MA_SUCCESS && totalFramesReadOut == 0) {
        result =  MA_AT_END;
    }

    return result;
}